

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_aout.c
# Opt level: O3

Symbol * aout_lnksym(GlobalVars *gv,Section *sec,Reloc *xref)

{
  char *__s2;
  char *__s1;
  int iVar1;
  Symbol *pSVar2;
  char **ppcVar3;
  ulong uVar4;
  
  if (gv->dest_object == 0) {
    __s2 = xref->xrefname;
    ppcVar3 = aout_symnames;
    uVar4 = 0;
    do {
      __s1 = *ppcVar3;
      iVar1 = strcmp(__s1,__s2);
      if (iVar1 == 0) {
        pSVar2 = addlnksymbol(gv,__s1,0,'\x01','\x01','\x01','\x02',0);
        pSVar2->extra = (uint32_t)uVar4;
        if (uVar4 < 2) {
          gv->got_base_name = __s1;
          pSVar2->type = '\x02';
          return pSVar2;
        }
        return pSVar2;
      }
      uVar4 = uVar4 + 1;
      ppcVar3 = ppcVar3 + 1;
    } while (uVar4 != 3);
  }
  return (Symbol *)0x0;
}

Assistant:

struct Symbol *aout_lnksym(struct GlobalVars *gv,struct Section *sec,
                           struct Reloc *xref)
/* Check for common a.out linker symbols. */
{
  struct Symbol *sym;
  int i;

  if (!gv->dest_object) {
    for (i=0; i<AOUTSTD_LNKSYMS; i++) {
      if (!strcmp(aout_symnames[i],xref->xrefname)) {
        sym = addlnksymbol(gv,aout_symnames[i],0,SYM_ABS,
                           SYMF_LNKSYM,SYMI_OBJECT,SYMB_GLOBAL,0);
        sym->extra = i; /* for easy ident. in aout_setlnksym */
        switch (i) {
          case GOTSYM:
            gv->got_base_name = aout_symnames[i];
            sym->type = SYM_RELOC;
            break;
          case PLTSYM:
            gv->got_base_name = aout_symnames[i];
            sym->type = SYM_RELOC;
            break;
          case DYNAMICSYM:
            break;
        }
        return (sym);  /* new linker symbol created */
      }
    }
  }
  return (NULL);
}